

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RangeCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RangeCoverageBinInitializerSyntax,slang::syntax::RangeListSyntax&,slang::syntax::WithClauseSyntax*&>
          (BumpAllocator *this,RangeListSyntax *args,WithClauseSyntax **args_1)

{
  WithClauseSyntax *pWVar1;
  RangeCoverageBinInitializerSyntax *pRVar2;
  
  pRVar2 = (RangeCoverageBinInitializerSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RangeCoverageBinInitializerSyntax *)this->endPtr < pRVar2 + 1) {
    pRVar2 = (RangeCoverageBinInitializerSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pRVar2 + 1);
  }
  pWVar1 = *args_1;
  (pRVar2->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind = RangeCoverageBinInitializer;
  (pRVar2->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pRVar2->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pRVar2->ranges).ptr = args;
  pRVar2->withClause = pWVar1;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pRVar2;
  if (pWVar1 != (WithClauseSyntax *)0x0) {
    (pWVar1->super_SyntaxNode).parent = (SyntaxNode *)pRVar2;
  }
  return pRVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }